

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O0

bool ON_EvaluateQuotientRule(int dim,int der_count,int v_stride,double *v)

{
  double dVar1;
  double *pdVar2;
  double dVar3;
  int local_54;
  int df;
  int n;
  int j;
  int i;
  double *w;
  double *x;
  double *f;
  double w2;
  double wt;
  double *v_local;
  int v_stride_local;
  int der_count_local;
  int dim_local;
  
  dVar1 = v[dim];
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    n = (der_count + 1) * v_stride;
    w = v;
    while (n != 0) {
      *w = (1.0 / dVar1) * *w;
      n = n + -1;
      w = w + 1;
    }
    if (der_count != 0) {
      dVar1 = -(v + v_stride)[dim];
      df = dim;
      w = v + v_stride;
      x = v;
      while (df != 0) {
        *w = dVar1 * *x + *w;
        df = df + -1;
        w = w + 1;
        x = x + 1;
      }
      if (1 < der_count) {
        x = v + v_stride;
        dVar3 = (x + v_stride)[dim];
        df = dim;
        w = x + v_stride;
        wt = (double)v;
        while (df != 0) {
          *w = -dVar3 * *(double *)wt + dVar1 * 2.0 * *x + *w;
          df = df + -1;
          w = w + 1;
          x = x + 1;
          wt = (double)((long)wt + 8);
        }
        if (2 < der_count) {
          pdVar2 = (double *)((long)wt + (long)dim * -8);
          w = pdVar2 + (v_stride << 1);
          for (local_54 = 3; local_54 <= der_count; local_54 = local_54 + 1) {
            w = w + v_stride;
            _j = pdVar2 + (long)(local_54 * v_stride) + (long)dim;
            x = pdVar2;
            for (n = 0; n < local_54; n = n + 1) {
              dVar3 = ON_BinomialCoefficient(local_54 - n,n);
              dVar1 = *_j;
              _j = _j + -(long)v_stride;
              df = dim;
              while (df != 0) {
                *w = *x * -dVar3 * dVar1 + *w;
                df = df + -1;
                w = w + 1;
                x = x + 1;
              }
              w = w + -(long)dim;
              x = x + (v_stride - dim);
            }
          }
        }
      }
    }
    der_count_local._3_1_ = true;
  }
  else {
    der_count_local._3_1_ = false;
  }
  return der_count_local._3_1_;
}

Assistant:

bool ON_EvaluateQuotientRule( int dim, int der_count, int v_stride, double *v )
{
  /*
  The quotient rule says the n-th derivative is

            (n)       (n)          (n)             (n-1)    (1)              (1)    (n-1)
          f  (t) =  x   (t)  -  (w  (t)*f(t) + n*w    (t)*f  (t) + ... + n*w  (t)*f    (t))
                    ---------------------------------------------------------------------
                                             w(t)


                                                                        (i)   (j)
         (The missing summands look like  ON_BinomialCoefficient(i,j)*w   * f    )
  */

  double
    wt, w2, *f, *x, *w;
  int
    i, j, n, df;

  wt = v[dim];
  if (wt == 0.0)
    return false;
  wt = 1.0/wt;
  i = (der_count+1)*v_stride;
  x = v;
  while(i--) *x++ *= wt;

  if (der_count) {
    // 1rst derivative - faster special case 
    f = v;            // f = func(t)
    x = v + v_stride; // x = numerator'(t)/w
    wt = -x[dim];     // wt = -denominator'(t)/w
    j = dim; while (j--) *x++ +=  wt* *f++;
    if (der_count> 1) {
      // 2nd derivative - faster special case 
      f = v + v_stride;
      x = f + v_stride;
      // v = func(t), f = func'(t), x = numerator''(t)/w, 
      // * wt = -2*denominator'(t)/w, w2 = denominator''(t)/w
      wt *= 2.0;
      w2 = -x[dim];
      j = dim; while(j--) *x++ += w2* *v++ + wt* *f++;
      if (der_count>2) {
        df = v_stride-dim;
        // higher derivatives use slower loop
        v -= dim;
        x = v + v_stride*2;
        for (n = 3; n <= der_count; n++) {
          // computing n-th derivative
          f = v;
          x += v_stride; // x = numerator^(n)/weight 
          w = v + n*v_stride + dim;
          for (i = 0; i < n; i++) {
            // f = value of i-th derivative 
            // w = ((n-i)-th derivative of denominator)/weight
            wt = -ON_BinomialCoefficient(n-i,i) * *w;
            w -= v_stride;
            j = dim; while (j--) *x++ += *f++ * wt;
            x -= dim;
            f += df;
          }
        }
      }
    }
  }

  return true;
}